

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RVOSimulator.cpp
# Opt level: O0

void __thiscall RVO::RVOSimulator::removeAgent(RVOSimulator *this,size_t agentNo)

{
  Agent *this_00;
  value_type pAVar1;
  reference ppAVar2;
  size_t agentNo_local;
  RVOSimulator *this_local;
  
  ppAVar2 = std::vector<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>::operator[]
                      (&this->agents_,agentNo);
  this_00 = *ppAVar2;
  if (this_00 != (Agent *)0x0) {
    Agent::~Agent(this_00);
    operator_delete(this_00,0xa8);
  }
  ppAVar2 = std::vector<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>::back(&this->agents_);
  pAVar1 = *ppAVar2;
  ppAVar2 = std::vector<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>::operator[]
                      (&this->agents_,agentNo);
  *ppAVar2 = pAVar1;
  std::vector<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>::pop_back(&this->agents_);
  return;
}

Assistant:

void RVOSimulator::removeAgent(size_t agentNo)
	{
		delete agents_[agentNo];
		agents_[agentNo] = agents_.back();
		agents_.pop_back();
	}